

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QTableWidgetItem_*>::insert
          (QPodArrayOps<QTableWidgetItem_*> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QTableWidgetItem **ppQVar1;
  QTableWidgetItem *in_RCX;
  long in_RDX;
  long in_RSI;
  QArrayDataPointer<QTableWidgetItem_*> *in_RDI;
  QTableWidgetItem **where;
  GrowthPosition pos;
  QTableWidgetItem *copy;
  QTableWidgetItem ***in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  QTableWidgetItem *this_00;
  long local_18;
  
  uVar2 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar2 = 1;
  }
  this_00 = in_RCX;
  QArrayDataPointer<QTableWidgetItem_*>::detachAndGrow
            ((QArrayDataPointer<QTableWidgetItem_*> *)in_RCX,(GrowthPosition)((ulong)in_RCX >> 0x20)
             ,CONCAT44(uVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,in_RDI);
  ppQVar1 = createHole((QPodArrayOps<QTableWidgetItem_*> *)this_00,
                       (GrowthPosition)((ulong)in_RCX >> 0x20),
                       CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                       (qsizetype)in_stack_ffffffffffffffc8);
  local_18 = in_RDX;
  while (local_18 != 0) {
    *ppQVar1 = in_RCX;
    ppQVar1 = ppQVar1 + 1;
    local_18 = local_18 + -1;
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        while (n--)
            *where++ = copy;
    }